

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O0

insert_result * __thiscall
crnlib::
hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>
::insert(hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>
         *this,cluster_id *k,uint *v)

{
  bool bVar1;
  hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>
  *in_RSI;
  insert_result *in_RDI;
  uint *in_stack_00000010;
  insert_result *result;
  uint in_stack_000001c4;
  char *in_stack_000001c8;
  char *in_stack_000001d0;
  
  std::
  pair<crnlib::hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>::iterator,_bool>
  ::
  pair<crnlib::hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>::iterator,_bool,_true>
            ((pair<crnlib::hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>::iterator,_bool>
              *)in_RSI);
  bVar1 = insert_no_grow(this,(insert_result *)k,(cluster_id *)v,in_stack_00000010);
  if (!bVar1) {
    grow(in_RSI);
    bVar1 = insert_no_grow(this,(insert_result *)k,(cluster_id *)v,in_stack_00000010);
    if (!bVar1) {
      crnlib_fail(in_stack_000001d0,in_stack_000001c8,in_stack_000001c4);
    }
  }
  return in_RDI;
}

Assistant:

inline insert_result insert(const Key& k, const Value& v = Value()) {
    insert_result result;
    if (!insert_no_grow(result, k, v)) {
      grow();

      // This must succeed.
      if (!insert_no_grow(result, k, v)) {
        CRNLIB_FAIL("insert() failed");
      }
    }

    return result;
  }